

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_MaterialRef::Write(ON_MaterialRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_MaterialRef *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,1);
  if (local_19) {
    if (local_19) {
      local_19 = ON_BinaryArchive::WriteUuid(archive,&this->m_plugin_id);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteUuid(archive,&this->m_material_id);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(archive,0);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteUuid(archive,&this->m_material_backface_id);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_material_source);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_MaterialRef::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 1 );
  if (rc)
  {
    if (rc) rc = archive.WriteUuid( m_plugin_id );
    if (rc) rc = archive.WriteUuid( m_material_id );

    // 23 May 2006 Dale lear
    //   m_mapping_channels[] was removed from ON_MaterialRef.
    //   To keep from breaking the file format, I need to
    //   write a zero as the array length.
    //
    //if (rc) rc = archive.WriteArray( m_mapping_channels );
    if (rc) rc = archive.WriteInt(0);

    // 23 May 2006 added
    if (rc) rc = archive.WriteUuid( m_material_backface_id );
    if (rc) rc = archive.WriteInt( m_material_source );


    if ( !archive.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}